

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void shift_reg_imm(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dst,TCGv_i64 src,int sf,
                  a64_shift_type shift_type,uint shift_i)

{
  TCGv_i64 shift_amount;
  uint uVar1;
  TCGv_i64 shift_const;
  uint shift_i_local;
  a64_shift_type shift_type_local;
  int sf_local;
  TCGv_i64 src_local;
  TCGv_i64 dst_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  uVar1 = 0x20;
  if (sf != 0) {
    uVar1 = 0x40;
  }
  if (shift_i < uVar1) {
    if (shift_i == 0) {
      tcg_gen_mov_i64_aarch64(tcg_ctx,dst,src);
    }
    else {
      shift_amount = tcg_const_i64_aarch64(tcg_ctx,(ulong)shift_i);
      shift_reg(tcg_ctx,dst,src,sf,shift_type,shift_amount);
      tcg_temp_free_i64(tcg_ctx,shift_amount);
    }
    return;
  }
  __assert_fail("shift_i < (sf ? 64 : 32)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x1144,
                "void shift_reg_imm(TCGContext *, TCGv_i64, TCGv_i64, int, enum a64_shift_type, unsigned int)"
               );
}

Assistant:

static void shift_reg_imm(TCGContext *tcg_ctx, TCGv_i64 dst, TCGv_i64 src, int sf,
                          enum a64_shift_type shift_type, unsigned int shift_i)
{
    assert(shift_i < (sf ? 64 : 32));

    if (shift_i == 0) {
        tcg_gen_mov_i64(tcg_ctx, dst, src);
    } else {
        TCGv_i64 shift_const;

        shift_const = tcg_const_i64(tcg_ctx, shift_i);
        shift_reg(tcg_ctx, dst, src, sf, shift_type, shift_const);
        tcg_temp_free_i64(tcg_ctx, shift_const);
    }
}